

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# green.c
# Opt level: O0

int green_future_release(green_future_t future)

{
  int iVar1;
  green_future_t future_local;
  
  if (future == (green_future_t)0x0) {
    future_local._4_4_ = 1;
  }
  else {
    fprintf(_stderr,"green_future_release(%p, %d)\n",future,(ulong)(uint)future->refs);
    if (future == (green_future_t)0x0) {
      fprintf(_stderr,"Assertion failed: \"%s\". at %s:%d\n","future != ((void*)0)",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/src/green.c"
              ,0x245);
      fflush(_stderr);
      abort();
    }
    if (future->refs < 1) {
      fprintf(_stderr,"Assertion failed: \"%s\". at %s:%d\n","future->refs > 0",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/src/green.c"
              ,0x246);
      fflush(_stderr);
      abort();
    }
    iVar1 = future->refs + -1;
    future->refs = iVar1;
    if (iVar1 == 0) {
      if (future->poller != (green_poller_t)0x0) {
        fprintf(_stderr,"Assertion failed: \"%s\". at %s:%d\n","future->poller == ((void*)0)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/src/green.c"
                ,0x248);
        fflush(_stderr);
        abort();
      }
      green_free(future);
    }
    future_local._4_4_ = 0;
  }
  return future_local._4_4_;
}

Assistant:

int green_future_release(green_future_t future)
{
    if (future == NULL) {
        return GREEN_EINVAL;
    }
    fprintf(stderr, "green_future_release(%p, %d)\n", future, future->refs);
    // NOTE: async operations hold an implicit ref count, so there is no risk
    //       of async operations dereferencing a dangling pointer when
    //       attempting to resolve the future.
    green_assert(future != NULL);
    green_assert(future->refs > 0);
    if (--future->refs == 0) {
        green_assert(future->poller == NULL);
        green_free(future);
    }
    return GREEN_SUCCESS;
}